

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestExpectEvalsOnceInternal::Run(TestExpectEvalsOnceInternal *this)

{
  int iVar1;
  Outputter *pOVar2;
  bool bVar3;
  string local_a0;
  int *local_78;
  undefined4 local_70 [2];
  testinator local_68 [8];
  char *local_60;
  undefined4 local_58;
  char *local_50;
  int *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined4 *local_28;
  char *local_20;
  
  iVar1 = CountEvals::s_evals + 2;
  local_78 = &CountEvals::s_evals;
  local_70[0] = 2;
  bVar3 = CountEvals::s_evals != 0;
  CountEvals::s_evals = iVar1;
  if (bVar3) {
    local_28 = local_70;
    pOVar2 = (this->super_Test).m_op;
    local_60 = 
    "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
    ;
    local_58 = 0xe9;
    local_50 = " (CountEvals::s_evals == 2 => ";
    local_48 = &CountEvals::s_evals;
    local_40 = " ";
    local_38 = "==";
    local_30 = " ";
    local_20 = ")";
    testinator::
    Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
              (&local_a0,local_68,
               (Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
                *)"==");
    (*pOVar2->_vptr_Outputter[3])(pOVar2,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    (this->super_Test).m_success = false;
  }
  return true;
}

Assistant:

bool inc() { ++s_evals; return true; }